

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmGlobalGenerator::GetDirectoryContent(cmGlobalGenerator *this,string *dir,bool needDisk)

{
  char *__s;
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  allocator<char> local_81;
  value_type local_80;
  char *local_60;
  char *f;
  unsigned_long i;
  unsigned_long n;
  Directory local_38;
  Directory d;
  long mt;
  DirectoryContent *dc;
  bool needDisk_local;
  string *dir_local;
  cmGlobalGenerator *this_local;
  
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::DirectoryContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::DirectoryContent>_>_>
           ::operator[](&this->DirectoryContentMap,dir);
  if ((needDisk) &&
     (d.Internal = (DirectoryInternals *)cmsys::SystemTools::ModifiedTime(dir),
     d.Internal != (DirectoryInternals *)pmVar3->LastDiskTime)) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pmVar3->All,&pmVar3->Generated);
    cmsys::Directory::Directory(&local_38);
    bVar1 = cmsys::Directory::Load(&local_38,dir);
    if (bVar1) {
      i = cmsys::Directory::GetNumberOfFiles(&local_38);
      for (f = (char *)0x0; f < i; f = f + 1) {
        local_60 = cmsys::Directory::GetFile(&local_38,(unsigned_long)f);
        iVar2 = strcmp(local_60,".");
        if ((iVar2 != 0) && (iVar2 = strcmp(local_60,".."), __s = local_60, iVar2 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&pmVar3->All,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::allocator<char>::~allocator(&local_81);
        }
      }
    }
    pmVar3->LastDiskTime = (long)d.Internal;
    cmsys::Directory::~Directory(&local_38);
  }
  return &pmVar3->All;
}

Assistant:

std::set<std::string> const& cmGlobalGenerator::GetDirectoryContent(
  std::string const& dir, bool needDisk)
{
  DirectoryContent& dc = this->DirectoryContentMap[dir];
  if (needDisk) {
    long mt = cmSystemTools::ModifiedTime(dir);
    if (mt != dc.LastDiskTime) {
      // Reset to non-loaded directory content.
      dc.All = dc.Generated;

      // Load the directory content from disk.
      cmsys::Directory d;
      if (d.Load(dir)) {
        unsigned long n = d.GetNumberOfFiles();
        for (unsigned long i = 0; i < n; ++i) {
          const char* f = d.GetFile(i);
          if (strcmp(f, ".") != 0 && strcmp(f, "..") != 0) {
            dc.All.insert(f);
          }
        }
      }
      dc.LastDiskTime = mt;
    }
  }
  return dc.All;
}